

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInIndexByHandle
              (void *handle,void *tx_data_handle,char *txid,uint32_t vout,uint32_t *index)

{
  pointer pcVar1;
  long *plVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t uVar5;
  CfdException *pCVar6;
  OutPoint outpoint;
  bool is_bitcoin;
  allocator local_99;
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  string local_50;
  
  cfd::Initialize();
  pcVar1 = local_98 + 0x10;
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  bVar4 = cfd::capi::IsEmptyString(txid);
  if (bVar4) {
    local_98._0_8_ = "cfdcapi_transaction.cpp";
    local_98._8_4_ = 0xfbb;
    local_98._16_8_ = "CfdGetTxInIndexByHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_50,txid,&local_99);
  cfd::core::Txid::Txid((Txid *)local_70,&local_50);
  cfd::core::OutPoint::OutPoint((OutPoint *)local_98,(Txid *)local_70,vout);
  local_70._0_8_ = &PTR__Txid_0087c9b8;
  if ((pointer)local_70._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._8_8_,local_70._24_8_ - local_70._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p._0_1_ = '\0';
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),(bool *)&local_50);
  plVar2 = *(long **)((long)tx_data_handle + 0x18);
  if (plVar2 == (long *)0x0) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_70);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((char)local_50._M_dataplus._M_p == '\x01') {
    if (index == (uint32_t *)0x0) goto LAB_0047e7a9;
    uVar5 = (**(code **)(*plVar2 + 0x78))(plVar2,local_98);
  }
  else {
    if (index == (uint32_t *)0x0) goto LAB_0047e7a9;
    uVar5 = (**(code **)(*plVar2 + 0x78))(plVar2,local_98);
  }
  *index = uVar5;
LAB_0047e7a9:
  local_98._0_8_ = &PTR__Txid_0087c9b8;
  pvVar3 = (void *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_98._24_8_ - (long)pvVar3);
  }
  return 0;
}

Assistant:

int CfdGetTxInIndexByHandle(
    void* handle, void* tx_data_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    OutPoint outpoint(Txid(txid), vout);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}